

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ExportOptions * dpfb::createExportOpions(void)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  runtime_error *prVar4;
  ExportOptions *in_RDI;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8 [8];
  string outDir;
  string local_b0 [32];
  ImageSizeMode local_90;
  allocator local_89;
  ImageSizeMode imageSizeMode;
  dpfb local_68 [55];
  allocator local_31;
  string local_30 [8];
  string exportName;
  
  pcVar1 = args::fontExportName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  uVar3 = std::__cxx11::string::empty();
  pcVar1 = args::fontPath;
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&imageSizeMode,pcVar1,&local_89);
    getFontExportNameFromPath(local_68,(string *)&imageSizeMode);
    std::__cxx11::string::operator=(local_30,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&imageSizeMode);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if (0 < args::imageMaxCount) {
    iVar2 = strcmp(args::imageSizeMode,"min");
    if (iVar2 == 0) {
      local_90 = min;
    }
    else {
      iVar2 = strcmp(args::imageSizeMode,"min-pot");
      if (iVar2 == 0) {
        local_90 = minPot;
      }
      else {
        iVar2 = strcmp(args::imageSizeMode,"max");
        if (iVar2 != 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          str::format_abi_cxx11_
                    ((char *)local_b0,"Invalid image size mode \"%s\"",args::imageSizeMode);
          std::runtime_error::runtime_error(prVar4,local_b0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_90 = max;
      }
    }
    pcVar1 = args::outDir;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    addTrailingPathSeparator((string *)local_d8);
    std::__cxx11::string::string((string *)in_RDI,local_30);
    pcVar1 = args::fontExportFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&in_RDI->fontFormat,pcVar1,&local_da);
    pcVar1 = args::imageFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&in_RDI->imageFormat,pcVar1,&local_db);
    in_RDI->imageMaxCount = args::imageMaxCount;
    in_RDI->imageSizeMode = local_90;
    std::__cxx11::string::string((string *)&in_RDI->outDir,local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_db);
    std::allocator<char>::~allocator((allocator<char> *)&local_da);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_30);
    return in_RDI;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Image max count should be > 0");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ExportOptions createExportOpions()
{
    std::string exportName = args::fontExportName;
    if (exportName.empty())
        exportName = getFontExportNameFromPath(args::fontPath);

    if (args::imageMaxCount <= 0)
        throw std::runtime_error("Image max count should be > 0");

    ImageSizeMode imageSizeMode;
    if (std::strcmp(args::imageSizeMode, "min") == 0)
        imageSizeMode = ImageSizeMode::min;
    else if (std::strcmp(args::imageSizeMode, "min-pot") == 0)
        imageSizeMode = ImageSizeMode::minPot;
    else if (std::strcmp(args::imageSizeMode, "max") == 0)
        imageSizeMode = ImageSizeMode::max;
    else
        throw std::runtime_error(str::format(
            "Invalid image size mode \"%s\"", args::imageSizeMode));

    std::string outDir = args::outDir;
    addTrailingPathSeparator(outDir);

    return {
        exportName,
        args::fontExportFormat,
        args::imageFormat,
        args::imageMaxCount,
        imageSizeMode,
        outDir
    };
}